

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O2

void __thiscall
llm_build_glm4::llm_build_glm4
          (llm_build_glm4 *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  llama_hparams *this_00;
  ggml_context *pgVar2;
  uint32_t uVar3;
  ggml_tensor *pgVar4;
  llm_graph_input_attn_kv_unified *inp;
  ulong uVar5;
  ggml_tensor *pgVar6;
  undefined8 uVar7;
  ggml_tensor *pgVar8;
  ggml_tensor *pgVar9;
  pointer plVar10;
  undefined8 uVar11;
  long lVar12;
  int il;
  int il_00;
  long lVar13;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 uVar14;
  ggml_tensor *local_68;
  
  llm_graph_context::llm_graph_context(&this->super_llm_graph_context,params);
  this_00 = (this->super_llm_graph_context).hparams;
  uVar1 = this_00->n_embd_head_v;
  uVar3 = llama_hparams::n_embd_v_gqa(this_00,0);
  if (uVar1 == ((this->super_llm_graph_context).hparams)->n_embd_head_k) {
    local_68 = llm_graph_context::build_inp_embd(&this->super_llm_graph_context,model->tok_embd);
    pgVar4 = llm_graph_context::build_inp_pos(&this->super_llm_graph_context);
    inp = llm_graph_context::build_attn_inp_kv_unified(&this->super_llm_graph_context);
    uVar5 = (ulong)uVar3;
    lVar12 = 0;
    for (lVar13 = 0; uVar14 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20),
        lVar13 < (this->super_llm_graph_context).n_layer; lVar13 = lVar13 + 1) {
      il_00 = (int)lVar13;
      pgVar6 = llm_graph_context::build_norm
                         (&this->super_llm_graph_context,local_68,
                          *(ggml_tensor **)
                           ((long)&((model->layers).
                                    super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->attn_norm + lVar12),
                          (ggml_tensor *)0x0,LLM_NORM_RMS,il_00);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"attn_norm",il_00);
      plVar10 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pgVar8 = *(ggml_tensor **)((long)&plVar10->wqkv + lVar12);
      if (pgVar8 == (ggml_tensor *)0x0) {
        pgVar8 = llm_graph_context::build_lora_mm
                           (&this->super_llm_graph_context,
                            *(ggml_tensor **)((long)&plVar10->wq + lVar12),pgVar6);
        plVar10 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (*(long *)((long)&plVar10->bq + lVar12) != 0) {
          pgVar8 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar8);
          plVar10 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        }
        pgVar9 = llm_graph_context::build_lora_mm
                           (&this->super_llm_graph_context,
                            *(ggml_tensor **)((long)&plVar10->wk + lVar12),pgVar6);
        plVar10 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (*(long *)((long)&plVar10->bk + lVar12) != 0) {
          pgVar9 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar9);
          plVar10 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        }
        pgVar6 = llm_graph_context::build_lora_mm
                           (&this->super_llm_graph_context,
                            *(ggml_tensor **)((long)&plVar10->wv + lVar12),pgVar6);
        if (*(long *)((long)&((model->layers).
                              super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                              super__Vector_impl_data._M_start)->bv + lVar12) != 0) {
          pgVar6 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar6);
        }
      }
      else {
        pgVar6 = llm_graph_context::build_lora_mm(&this->super_llm_graph_context,pgVar8,pgVar6);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"wqkv",il_00);
        if (*(long *)((long)&((model->layers).
                              super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                              super__Vector_impl_data._M_start)->bqkv + lVar12) != 0) {
          pgVar6 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar6);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"bqkv",il_00);
        }
        pgVar2 = (this->super_llm_graph_context).ctx0;
        uVar7 = ggml_view_2d(pgVar2,pgVar6,(this->super_llm_graph_context).n_embd,
                             (long)(this->super_llm_graph_context).n_tokens,pgVar6->nb[1],0);
        pgVar8 = (ggml_tensor *)ggml_cont(pgVar2,uVar7);
        pgVar2 = (this->super_llm_graph_context).ctx0;
        uVar7 = ggml_view_2d(pgVar2,pgVar6,uVar5,(long)(this->super_llm_graph_context).n_tokens,
                             pgVar6->nb[1],(this->super_llm_graph_context).n_embd << 2);
        pgVar9 = (ggml_tensor *)ggml_cont(pgVar2,uVar7);
        pgVar2 = (this->super_llm_graph_context).ctx0;
        uVar7 = ggml_view_2d(pgVar2,pgVar6,uVar5,(long)(this->super_llm_graph_context).n_tokens,
                             pgVar6->nb[1],((this->super_llm_graph_context).n_embd + uVar5) * 4);
        pgVar6 = (ggml_tensor *)ggml_cont(pgVar2,uVar7);
      }
      uVar7 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar8,uVar1,
                              (this->super_llm_graph_context).n_head,
                              (long)(this->super_llm_graph_context).n_tokens);
      uVar11 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar9,uVar1,
                               (this->super_llm_graph_context).n_head_kv,
                               (long)(this->super_llm_graph_context).n_tokens);
      pgVar8 = (ggml_tensor *)
               ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar6,uVar1,
                               (this->super_llm_graph_context).n_head_kv,
                               (long)(this->super_llm_graph_context).n_tokens);
      pgVar6 = (ggml_tensor *)
               ggml_rope_ext((this->super_llm_graph_context).freq_base,
                             (this->super_llm_graph_context).freq_scale,
                             (this->super_llm_graph_context).ext_factor,
                             (this->super_llm_graph_context).attn_factor,
                             (this->super_llm_graph_context).beta_fast,
                             (this->super_llm_graph_context).beta_slow,
                             (this->super_llm_graph_context).ctx0,uVar7,pgVar4,0,
                             (int)(this->super_llm_graph_context).n_rot,
                             (this->super_llm_graph_context).rope_type,
                             CONCAT44(uVar14,(this->super_llm_graph_context).n_ctx_orig));
      pgVar9 = (ggml_tensor *)
               ggml_rope_ext((this->super_llm_graph_context).freq_base,
                             (this->super_llm_graph_context).freq_scale,
                             (this->super_llm_graph_context).ext_factor,
                             (this->super_llm_graph_context).attn_factor,
                             (this->super_llm_graph_context).beta_fast,
                             (this->super_llm_graph_context).beta_slow,
                             (this->super_llm_graph_context).ctx0,uVar11,pgVar4,0,
                             (int)(this->super_llm_graph_context).n_rot,
                             (this->super_llm_graph_context).rope_type,
                             (this->super_llm_graph_context).n_ctx_orig);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Qcur",il_00);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar9,"Kcur",il_00);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"Vcur",il_00);
      pgVar8 = llm_graph_context::build_attn
                         (&this->super_llm_graph_context,inp,gf,
                          *(ggml_tensor **)
                           ((long)&((model->layers).
                                    super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->wo + lVar12),
                          (ggml_tensor *)0x0,pgVar6,pgVar9,pgVar8,(ggml_tensor *)0x0,
                          (ggml_tensor *)0x0,1.0 / SQRT((float)uVar1),il_00);
      if (lVar13 == (this->super_llm_graph_context).n_layer + -1) {
        pgVar6 = llm_graph_context::build_inp_out_ids(&this->super_llm_graph_context);
        pgVar8 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar8,pgVar6);
        local_68 = (ggml_tensor *)
                   ggml_get_rows((this->super_llm_graph_context).ctx0,local_68,pgVar6);
      }
      pgVar8 = llm_graph_context::build_norm
                         (&this->super_llm_graph_context,pgVar8,
                          *(ggml_tensor **)
                           ((long)&((model->layers).
                                    super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->attn_post_norm +
                           lVar12),(ggml_tensor *)0x0,LLM_NORM_RMS,il_00);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"post_attn_norm",il_00);
      pgVar8 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar8,local_68);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"ffn_inp",il_00);
      pgVar6 = llm_graph_context::build_norm
                         (&this->super_llm_graph_context,pgVar8,
                          *(ggml_tensor **)
                           ((long)&((model->layers).
                                    super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->ffn_norm + lVar12),
                          (ggml_tensor *)0x0,LLM_NORM_RMS,il_00);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"ffn_norm",il_00);
      plVar10 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                _M_impl.super__Vector_impl_data._M_start;
      in_stack_ffffffffffffff38 = 0;
      pgVar6 = llm_graph_context::build_ffn
                         (&this->super_llm_graph_context,pgVar6,
                          *(ggml_tensor **)((long)&plVar10->ffn_up + lVar12),(ggml_tensor *)0x0,
                          (ggml_tensor *)0x0,(ggml_tensor *)0x0,(ggml_tensor *)0x0,
                          (ggml_tensor *)0x0,*(ggml_tensor **)((long)&plVar10->ffn_down + lVar12),
                          (ggml_tensor *)0x0,(ggml_tensor *)0x0,(ggml_tensor *)0x0,LLM_FFN_SWIGLU,
                          LLM_FFN_SEQ,il_00);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"ffn_out",il_00);
      pgVar6 = llm_graph_context::build_norm
                         (&this->super_llm_graph_context,pgVar6,
                          *(ggml_tensor **)
                           ((long)&((model->layers).
                                    super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->ffn_post_norm +
                           lVar12),(ggml_tensor *)0x0,LLM_NORM_RMS,il_00);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"post_mlp_norm",il_00);
      local_68 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar6,pgVar8);
      llm_graph_context::cb(&this->super_llm_graph_context,local_68,"l_out",il_00);
      lVar12 = lVar12 + 0x4f0;
    }
    pgVar4 = llm_graph_context::build_norm
                       (&this->super_llm_graph_context,local_68,model->output_norm,
                        (ggml_tensor *)0x0,LLM_NORM_RMS,-1);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar4,"result_norm",-1);
    ((this->super_llm_graph_context).res._M_t.
     super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
     super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
     super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar4;
    pgVar4 = llm_graph_context::build_lora_mm(&this->super_llm_graph_context,model->output,pgVar4);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar4,"result_output",-1);
    ((this->super_llm_graph_context).res._M_t.
     super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
     super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
     super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_logits = pgVar4;
    ggml_build_forward_expand(gf,pgVar4);
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
             ,0x2ad2,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
}

Assistant:

llm_build_glm4(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;
        const int64_t n_embd_gqa  = hparams.n_embd_v_gqa();

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            // Pre-attention norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm,
                    NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                ggml_tensor * Qcur = nullptr;
                ggml_tensor * Kcur = nullptr;
                ggml_tensor * Vcur = nullptr;

                if (model.layers[il].wqkv == nullptr) {
                    Qcur = build_lora_mm(model.layers[il].wq, cur);
                    if (model.layers[il].bq) {
                        Qcur = ggml_add(ctx0, Qcur, model.layers[il].bq);
                    }
                    Kcur = build_lora_mm(model.layers[il].wk, cur);
                    if (model.layers[il].bk) {
                        Kcur = ggml_add(ctx0, Kcur, model.layers[il].bk);
                    }
                    Vcur = build_lora_mm(model.layers[il].wv, cur);
                    if (model.layers[il].bv) {
                        Vcur = ggml_add(ctx0, Vcur, model.layers[il].bv);
                    }
                } else {
                    cur = build_lora_mm(model.layers[il].wqkv, cur);
                    cb(cur, "wqkv", il);
                    if (model.layers[il].bqkv) {
                        cur = ggml_add(ctx0, cur, model.layers[il].bqkv);
                        cb(cur, "bqkv", il);
                    }
                    Qcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd,     n_tokens, cur->nb[1], 0*sizeof(float)*(n_embd)));
                    Kcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*sizeof(float)*(n_embd)));
                    Vcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*sizeof(float)*(n_embd + n_embd_gqa)));
                }

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, NULL,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            // Post-attention norm (new!)
            cur = build_norm(cur,
                    model.layers[il].attn_post_norm,
                    NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "post_attn_norm", il);

            // Add the input (residual connection after post-attention norm)
            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // FF
            {
                // Pre-MLP norm
                cur = build_norm(ffn_inp,
                        model.layers[il].ffn_norm,
                        NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "ffn_norm", il);

                // MLP
                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   NULL, NULL,
                        NULL,                      NULL, NULL,
                        model.layers[il].ffn_down, NULL, NULL,
                        NULL,
                        LLM_FFN_SWIGLU, LLM_FFN_SEQ, il);
                cb(cur, "ffn_out", il);

                // Post-MLP norm
                cur = build_norm(cur,
                        model.layers[il].ffn_post_norm,
                        NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "post_mlp_norm", il);
            }

            // Add residual connection after post-MLP norm
            inpL = ggml_add(ctx0, cur, ffn_inp);
            cb(inpL, "l_out", il);
        }

        // Final norm
        cur = build_norm(inpL,
                model.output_norm,
                NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // Output projection
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }